

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLowering.cpp
# Opt level: O3

void __thiscall wasm::StringLowering::makeImports(StringLowering *this,Module *module)

{
  pointer puVar1;
  Expression *pEVar2;
  char cVar3;
  bool bVar4;
  char cVar5;
  long *plVar6;
  undefined1 reuse;
  uint uVar7;
  size_type *psVar8;
  Global *pGVar9;
  pointer puVar10;
  uint __val;
  bool bVar11;
  string_view sVar12;
  string_view sVar13;
  string_view s;
  string_view s_00;
  string_view str_00;
  undefined1 local_6a0 [8];
  stringstream json;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_690 [7];
  ios_base local_620 [264];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  undefined1 local_390 [8];
  stringstream utf8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  char *local_370;
  pointer pcStack_368;
  pointer local_360;
  ios_base local_310 [264];
  undefined1 local_208 [8];
  __string_type jsonString;
  size_t local_80;
  char *local_78;
  char *pcStack_68;
  vector<char,_std::allocator<char>_> vec;
  char local_31;
  
  local_390 = (undefined1  [8])&local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"string-constants-module","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_208,WasmStringConstsModule,(allocator<char> *)&local_518);
  pGVar9 = (Global *)local_208;
  Pass::getArgumentOrDefault((string *)local_6a0,(Pass *)this,(string *)local_390,(string *)pGVar9);
  sVar12._M_str = (char *)0x0;
  sVar12._M_len = (size_t)local_6a0;
  sVar12 = IString::interned(_json,sVar12,SUB81(pGVar9,0));
  if (local_6a0 != (undefined1  [8])local_690) {
    operator_delete((void *)local_6a0,local_690[0]._M_allocated_capacity + 1);
  }
  if (local_208 != (undefined1  [8])&jsonString._M_string_length) {
    operator_delete((void *)local_208,jsonString._M_string_length + 1);
  }
  if (local_390 != (undefined1  [8])&local_380) {
    operator_delete((void *)local_390,local_380._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_6a0);
  puVar10 = (module->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 != puVar1) {
    bVar11 = true;
    __val = 0;
    do {
      pEVar2 = ((puVar10->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init;
      if ((pEVar2 != (Expression *)0x0) && (pEVar2->_id == StringConstId)) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_390);
        if (this->useMagicImports == true) {
          bVar4 = String::convertUTF16ToUTF8
                            ((ostream *)local_380._M_local_buf,*(string_view *)(pEVar2 + 1));
          if (!bVar4) goto LAB_00a5c3ef;
          pGVar9 = (puVar10->_M_t).
                   super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                   super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
          local_80 = sVar12._M_len;
          (pGVar9->super_Importable).module.super_IString.str._M_len = local_80;
          local_78 = sVar12._M_str;
          *(char **)((long)&(pGVar9->super_Importable).module + 8) = local_78;
          std::__cxx11::stringbuf::str();
          s._M_str = (char *)0x0;
          s._M_len = (size_t)local_208;
          sVar13 = IString::interned((IString *)
                                     CONCAT44(jsonString._M_dataplus._M_p._4_4_,
                                              (uint)jsonString._M_dataplus._M_p),s,SUB81(local_78,0)
                                    );
          pGVar9 = (puVar10->_M_t).
                   super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                   super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
          (pGVar9->super_Importable).base.super_IString.str = sVar13;
          if (local_208 != (undefined1  [8])&jsonString._M_string_length) {
            operator_delete((void *)local_208,jsonString._M_string_length + 1);
          }
        }
        else {
LAB_00a5c3ef:
          if (this->assertUTF8 == true) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_208);
            std::__cxx11::stringbuf::str();
            sVar13._M_str = (char *)pGVar9;
            sVar13._M_len = (size_t)local_518._M_current;
            String::printEscaped
                      ((String *)&jsonString._M_string_length,(ostream *)str._M_dataplus._M_p,sVar13
                      );
            if ((size_type *)local_518._M_current != &str._M_string_length) {
              operator_delete(local_518._M_current,str._M_string_length + 1);
            }
            Fatal::Fatal((Fatal *)&local_518);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&str._M_string_length,"Cannot lower non-UTF-16 string ",0x1f);
            std::__cxx11::stringbuf::str();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&str._M_string_length,pcStack_68,
                       (long)vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
            local_31 = '\n';
            Fatal::operator<<((Fatal *)&local_518,&local_31);
            std::__cxx11::string::~string((string *)&pcStack_68);
            Fatal::~Fatal((Fatal *)&local_518);
          }
          sVar13 = IString::interned((IString *)0xc,(string_view)ZEXT816(0xe045c4),SUB81(pGVar9,0));
          pGVar9 = (puVar10->_M_t).
                   super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                   super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
          (pGVar9->super_Importable).module.super_IString.str = sVar13;
          cVar5 = '\x01';
          if (9 < __val) {
            pGVar9 = (Global *)(ulong)__val;
            cVar3 = '\x04';
            do {
              cVar5 = cVar3;
              uVar7 = (uint)pGVar9;
              if (uVar7 < 100) {
                cVar5 = cVar5 + -2;
                goto LAB_00a5c46f;
              }
              if (uVar7 < 1000) {
                cVar5 = cVar5 + -1;
                goto LAB_00a5c46f;
              }
              if (uVar7 < 10000) goto LAB_00a5c46f;
              pGVar9 = (Global *)((ulong)pGVar9 / 10000);
              cVar3 = cVar5 + '\x04';
            } while (99999 < uVar7);
            cVar5 = cVar5 + '\x01';
          }
LAB_00a5c46f:
          reuse = SUB81(pGVar9,0);
          local_208 = (undefined1  [8])&jsonString._M_string_length;
          std::__cxx11::string::_M_construct((ulong)local_208,cVar5);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)local_208,(uint)jsonString._M_dataplus._M_p,__val);
          s_00._M_str = (char *)0x0;
          s_00._M_len = (size_t)local_208;
          sVar13 = IString::interned((IString *)
                                     CONCAT44(jsonString._M_dataplus._M_p._4_4_,
                                              (uint)jsonString._M_dataplus._M_p),s_00,(bool)reuse);
          pGVar9 = (puVar10->_M_t).
                   super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                   super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
          (pGVar9->super_Importable).base.super_IString.str = sVar13;
          if (local_208 != (undefined1  [8])&jsonString._M_string_length) {
            operator_delete((void *)local_208,jsonString._M_string_length + 1);
          }
          if (!bVar11) {
            local_208[0] = 0x2c;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_690[0]._M_local_buf,local_208,1);
          }
          str_00._M_str = (char *)pGVar9;
          str_00._M_len = pEVar2[1].type.id;
          String::printEscapedJSON
                    ((String *)local_690[0]._M_local_buf,*(ostream **)(pEVar2 + 1),str_00);
          __val = __val + 1;
          bVar11 = false;
        }
        ((puVar10->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init = (Expression *)0x0;
        std::__cxx11::stringstream::~stringstream((stringstream *)local_390);
        std::ios_base::~ios_base(local_310);
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar1);
  }
  std::__cxx11::stringbuf::str();
  if (CONCAT44(jsonString._M_dataplus._M_p._4_4_,(uint)jsonString._M_dataplus._M_p) != 0) {
    if (this->assertUTF8 == true) {
      __assert_fail("!assertUTF8",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/StringLowering.cpp"
                    ,0x117,"void wasm::StringLowering::makeImports(Module *)");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
                   '[',(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208);
    plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)local_390,_utf8,0,'\x01');
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar8) {
      str._M_string_length = *psVar8;
      str.field_2._M_allocated_capacity = plVar6[3];
      local_518._M_current = (char *)&str._M_string_length;
    }
    else {
      str._M_string_length = *psVar8;
      local_518._M_current = (char *)*plVar6;
    }
    str._M_dataplus._M_p = (pointer)plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_390 != (undefined1  [8])&local_380) {
      operator_delete((void *)local_390,local_380._M_allocated_capacity + 1);
    }
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((vector<char,std::allocator<char>> *)&pcStack_68,local_518,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(str._M_dataplus._M_p + local_518._M_current),(allocator_type *)local_390);
    local_390 = (undefined1  [8])&local_380;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"string.consts","");
    local_370 = pcStack_68;
    pcStack_368 = vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_360 = vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_finish;
    pcStack_68 = (char *)0x0;
    vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::
    emplace_back<wasm::CustomSection>(&module->customSections,(CustomSection *)local_390);
    if (local_370 != (char *)0x0) {
      operator_delete(local_370,(long)local_360 - (long)local_370);
    }
    if (local_390 != (undefined1  [8])&local_380) {
      operator_delete((void *)local_390,local_380._M_allocated_capacity + 1);
    }
    if (pcStack_68 != (char *)0x0) {
      operator_delete(pcStack_68,
                      (long)vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pcStack_68);
    }
    if ((size_type *)local_518._M_current != &str._M_string_length) {
      operator_delete(local_518._M_current,str._M_string_length + 1);
    }
  }
  if (local_208 != (undefined1  [8])&jsonString._M_string_length) {
    operator_delete((void *)local_208,jsonString._M_string_length + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_6a0);
  std::ios_base::~ios_base(local_620);
  return;
}

Assistant:

void makeImports(Module* module) {
    Name stringConstsModule =
      getArgumentOrDefault("string-constants-module", WasmStringConstsModule);
    Index jsonImportIndex = 0;
    std::stringstream json;
    bool first = true;
    for (auto& global : module->globals) {
      if (global->init) {
        if (auto* c = global->init->dynCast<StringConst>()) {
          std::stringstream utf8;
          if (useMagicImports &&
              String::convertUTF16ToUTF8(utf8, c->string.str)) {
            global->module = stringConstsModule;
            global->base = Name(utf8.str());
          } else {
            if (assertUTF8) {
              std::stringstream escaped;
              String::printEscaped(escaped, utf8.str());
              Fatal() << "Cannot lower non-UTF-16 string " << escaped.str()
                      << '\n';
            }
            global->module = "string.const";
            global->base = std::to_string(jsonImportIndex);
            if (first) {
              first = false;
            } else {
              json << ',';
            }
            String::printEscapedJSON(json, c->string.str);
            jsonImportIndex++;
          }
          global->init = nullptr;
        }
      }
    }

    auto jsonString = json.str();
    if (!jsonString.empty()) {
      // If we are asserting UTF8, then we shouldn't be generating any JSON.
      assert(!assertUTF8);
      // Add a custom section with the JSON.
      auto str = '[' + jsonString + ']';
      auto vec = std::vector<char>(str.begin(), str.end());
      module->customSections.emplace_back(
        CustomSection{"string.consts", std::move(vec)});
    }
  }